

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Null(Builder *this)

{
  Value local_20;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  Value::Value(&local_20);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,&local_20);
  return;
}

Assistant:

void Null() { stack_.push_back(Value()); }